

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_bigfloat
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,string_type *str,
          error_code *ec)

{
  byte *pbVar1;
  pointer puVar2;
  uint8_t *puVar3;
  byte bVar4;
  uint64_t uVar5;
  ulong extraout_RAX;
  byte *pbVar6;
  basic_bigint<std::allocator<unsigned_char>_> *n_00;
  byte bVar7;
  cbor_errc __e;
  char cVar8;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_a0;
  basic_bigint<std::allocator<unsigned_char>_> local_78;
  basic_bigint<std::allocator<unsigned_char>_> local_50;
  
  uVar5 = get_uint64_value(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  if (uVar5 == 2) {
    pbVar6 = (this->source_).current_;
    if (pbVar6 < (this->source_).end_) {
      bVar7 = *pbVar6 >> 5;
      if (bVar7 == 0) {
        get_uint64_value(this,ec);
      }
      else {
        if (bVar7 != 1) goto LAB_00246f6e;
        get_int64_value(this,ec);
      }
      if (ec->_M_value != 0) {
        return;
      }
      pbVar6 = (this->source_).current_;
      pbVar1 = (this->source_).end_;
      if (pbVar6 < pbVar1) {
        bVar7 = *pbVar6;
        bVar4 = bVar7 >> 5;
        if (bVar4 == 0) {
          get_uint64_value(this,ec);
          if (ec->_M_value != 0) {
            return;
          }
          basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
          goto LAB_00246ff2;
        }
        if (bVar4 != 6) {
          if (bVar4 == 1) {
            basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
            if ((extraout_RAX & 1) != 0) {
              return;
            }
            goto LAB_00246ff2;
          }
          goto LAB_00246f6e;
        }
        pbVar6 = pbVar6 + 1;
        (this->source_).current_ = pbVar6;
        if (pbVar6 < pbVar1) {
          if ((*pbVar6 & 0xe0) != 0x40) {
LAB_00246ff2:
            basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
            return;
          }
          puVar2 = (this->bytes_buffer_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish != puVar2) {
            (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar2;
          }
          read_byte_string(this,&this->bytes_buffer_,ec);
          if (ec->_M_value == 0) {
            bVar7 = bVar7 & 0x1f;
            cVar8 = (char)str;
            if (bVar7 == 3) {
              std::__cxx11::string::push_back(cVar8);
              std::__cxx11::string::push_back(cVar8);
              puVar3 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        (&local_a0,1,puVar3,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
              local_50.field_0._0_1_ = local_50.field_0._0_1_ & 0xfc | 2;
              local_50.field_0.common_stor_.length_ = 1;
              local_50.field_0.short_stor_.values_[0] = 1;
              local_50.field_0.short_stor_.values_[1] = 0;
              n_00 = basic_bigint<std::allocator<unsigned_char>_>::operator-=(&local_50,&local_a0);
              basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_78,n_00);
              basic_bigint<std::allocator<unsigned_char>_>::operator=(&local_a0,&local_78);
              if (((local_78.field_0._0_1_ & 1) != 0) &&
                 ((pointer)local_78.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                operator_delete(local_78.field_0.dynamic_stor_.data_,
                                local_78.field_0.short_stor_.values_[0] << 3);
              }
              if (((local_50.field_0._0_1_ & 1) != 0) &&
                 ((pointer)local_50.field_0.short_stor_.values_[1] != (pointer)0x0)) {
                operator_delete(local_50.field_0.dynamic_stor_.data_,
                                local_50.field_0.short_stor_.values_[0] << 3);
              }
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&local_a0,str);
              basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat();
            }
            else if (bVar7 == 2) {
              std::__cxx11::string::push_back(cVar8);
              std::__cxx11::string::push_back(cVar8);
              puVar3 = (this->bytes_buffer_).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                        (&local_a0,1,puVar3,
                         (long)(this->bytes_buffer_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
              basic_bigint<std::allocator<unsigned_char>>::
              write_string_hex<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_bigint<std::allocator<unsigned_char>> *)&local_a0,str);
              basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>>::read_bigfloat
                        ((basic_cbor_parser<jsoncons::bytes_source,std::allocator<char>> *)&local_a0
                        );
            }
            goto LAB_00246ff2;
          }
          goto LAB_002470bf;
        }
      }
    }
    __e = unexpected_eof;
  }
  else {
LAB_00246f6e:
    __e = invalid_bigfloat;
  }
  std::error_code::operator=(ec,__e);
LAB_002470bf:
  this->more_ = false;
  return;
}

Assistant:

void read_bigfloat(string_type& str, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_bigfloat;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                str.push_back('-');
                str.push_back('0');
                str.push_back('x');
                jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-val), str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);

                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear(); 
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        str.push_back('0');
                        str.push_back('x');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string_hex(str);
                    }
                    else if (tag == 3)
                    {
                        str.push_back('-');
                        str.push_back('0');
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string_hex(str);
                        str[2] = 'x'; // overwrite minus
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_bigfloat;
                more_ = false;
                return;
            }
        }

        str.push_back('p');
        if (exponent >=0)
        {
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(exponent), str);
        }
        else
        {
            str.push_back('-');
            jsoncons::detail::integer_to_hex(static_cast<uint64_t>(-exponent), str);
        }
    }